

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O1

int BrotliSetDepth(int p0,HuffmanTree *pool,uint8_t *depth,int max_depth)

{
  short sVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  int stack [16];
  
  stack[0] = -1;
  uVar3 = 0;
  do {
    while( true ) {
      sVar1 = pool[p0].index_left_;
      if (sVar1 < 0) break;
      if (max_depth <= (int)uVar3) {
        return 0;
      }
      lVar4 = (long)(int)uVar3;
      uVar3 = uVar3 + 1;
      stack[lVar4 + 1] = (int)pool[p0].index_right_or_value_;
      p0 = (int)sVar1;
    }
    depth[pool[p0].index_right_or_value_] = (uint8_t)uVar3;
    if (-1 < (int)uVar3) {
      do {
        if (stack[uVar3] != -1) goto LAB_0013ae15;
        bVar2 = 0 < (int)uVar3;
        uVar3 = uVar3 - 1;
      } while (bVar2);
      uVar3 = 0xffffffff;
    }
LAB_0013ae15:
    if ((int)uVar3 < 0) {
      return 1;
    }
    p0 = stack[uVar3];
    stack[uVar3] = -1;
  } while( true );
}

Assistant:

BROTLI_BOOL BrotliSetDepth(
    int p0, HuffmanTree* pool, uint8_t* depth, int max_depth) {
  int stack[16];
  int level = 0;
  int p = p0;
  BROTLI_DCHECK(max_depth <= 15);
  stack[0] = -1;
  while (BROTLI_TRUE) {
    if (pool[p].index_left_ >= 0) {
      level++;
      if (level > max_depth) return BROTLI_FALSE;
      stack[level] = pool[p].index_right_or_value_;
      p = pool[p].index_left_;
      continue;
    } else {
      depth[pool[p].index_right_or_value_] = (uint8_t)level;
    }
    while (level >= 0 && stack[level] == -1) level--;
    if (level < 0) return BROTLI_TRUE;
    p = stack[level];
    stack[level] = -1;
  }
}